

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_8x4_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int *piVar1;
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  longlong lVar16;
  int8_t *piVar17;
  bool bVar18;
  long lVar19;
  undefined7 in_register_00000009;
  int iVar20;
  uint uVar21;
  int fliplr;
  ulong uVar22;
  bool bVar23;
  __m128i *cur_in;
  __m128i *palVar24;
  __m128i round;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i in [8];
  undefined8 local_b8;
  int iStack_b0;
  int iStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  piVar17 = av1_fwd_txfm_shift_ls[6];
  iVar20 = (int)CONCAT71(in_register_00000009,tx_type);
  uVar21 = iVar20 - 4;
  uVar22 = (ulong)(uint)(iVar20 << 3);
  iVar20 = 0;
  fliplr = 0;
  if ((byte)uVar21 < 0xc) {
    uVar21 = (uVar21 & 0xff) << 2;
    iVar20 = *(int *)(&DAT_00d99378 + uVar21);
    fliplr = *(int *)(&DAT_00d993a8 + uVar21);
  }
  pcVar3 = *(code **)((long)col_highbd_txfm4x4_arr + uVar22);
  pcVar4 = *(code **)((long)row_highbd_txfm4x8_arr + uVar22);
  load_buffer_8x4(input,(__m128i *)&local_b8,stride,iVar20,fliplr,(int)*av1_fwd_txfm_shift_ls[6]);
  palVar24 = (__m128i *)&local_b8;
  bVar18 = true;
  do {
    bVar23 = bVar18;
    (*pcVar3)(palVar24,palVar24,0xd,1);
    uVar9 = *(undefined4 *)((long)*palVar24 + 4);
    lVar13 = (*palVar24)[1];
    uVar10 = *(undefined4 *)((long)*palVar24 + 0xc);
    uVar5 = *(undefined4 *)((long)palVar24[1] + 4);
    lVar14 = palVar24[1][1];
    uVar6 = *(undefined4 *)((long)palVar24[1] + 0xc);
    uVar11 = *(undefined4 *)((long)palVar24[2] + 4);
    lVar15 = palVar24[2][1];
    uVar12 = *(undefined4 *)((long)palVar24[2] + 0xc);
    uVar7 = *(undefined4 *)((long)palVar24[3] + 4);
    lVar16 = palVar24[3][1];
    uVar8 = *(undefined4 *)((long)palVar24[3] + 0xc);
    (*palVar24)[0] = CONCAT44((int)palVar24[1][0],(int)(*palVar24)[0]);
    (*palVar24)[1] = CONCAT44((int)palVar24[3][0],(int)palVar24[2][0]);
    *(undefined4 *)(palVar24[1] + 1) = uVar9;
    *(undefined4 *)((long)palVar24[1] + 0xc) = uVar5;
    *(undefined4 *)palVar24[2] = uVar11;
    *(undefined4 *)((long)palVar24[2] + 4) = uVar7;
    *(int *)palVar24[2] = (int)lVar13;
    *(int *)((long)palVar24[2] + 4) = (int)lVar14;
    *(int *)(palVar24[2] + 1) = (int)lVar15;
    *(int *)((long)palVar24[2] + 0xc) = (int)lVar16;
    *(undefined4 *)(palVar24[3] + 1) = uVar10;
    *(undefined4 *)((long)palVar24[3] + 0xc) = uVar6;
    *(undefined4 *)palVar24[4] = uVar12;
    *(undefined4 *)((long)palVar24[4] + 4) = uVar8;
    palVar24 = (__m128i *)&local_78;
    bVar18 = false;
  } while (bVar23);
  bVar2 = piVar17[1];
  iVar20 = 1 << (~bVar2 & 0x1f);
  auVar29 = ZEXT416((uint)-(int)(char)bVar2);
  local_b8._0_4_ = (int)local_b8 + iVar20 >> auVar29;
  local_b8._4_4_ = local_b8._4_4_ + iVar20 >> auVar29;
  iStack_b0 = iStack_b0 + iVar20 >> auVar29;
  iStack_ac = iStack_ac + iVar20 >> auVar29;
  auVar25._0_4_ = local_a8._0_4_ + iVar20 >> auVar29;
  auVar25._4_4_ = local_a8._4_4_ + iVar20 >> auVar29;
  auVar25._8_4_ = local_a8._8_4_ + iVar20 >> auVar29;
  auVar25._12_4_ = local_a8._12_4_ + iVar20 >> auVar29;
  auVar27._0_4_ = local_98._0_4_ + iVar20 >> auVar29;
  auVar27._4_4_ = local_98._4_4_ + iVar20 >> auVar29;
  auVar27._8_4_ = local_98._8_4_ + iVar20 >> auVar29;
  auVar27._12_4_ = local_98._12_4_ + iVar20 >> auVar29;
  local_88 = local_88 + iVar20 >> auVar29;
  iStack_84 = iStack_84 + iVar20 >> auVar29;
  iStack_80 = iStack_80 + iVar20 >> auVar29;
  iStack_7c = iStack_7c + iVar20 >> auVar29;
  local_78 = local_78 + iVar20 >> auVar29;
  iStack_74 = iStack_74 + iVar20 >> auVar29;
  iStack_70 = iStack_70 + iVar20 >> auVar29;
  iStack_6c = iStack_6c + iVar20 >> auVar29;
  local_68 = local_68 + iVar20 >> auVar29;
  iStack_64 = iStack_64 + iVar20 >> auVar29;
  iStack_60 = iStack_60 + iVar20 >> auVar29;
  iStack_5c = iStack_5c + iVar20 >> auVar29;
  local_58 = local_58 + iVar20 >> auVar29;
  iStack_54 = iStack_54 + iVar20 >> auVar29;
  iStack_50 = iStack_50 + iVar20 >> auVar29;
  iStack_4c = iStack_4c + iVar20 >> auVar29;
  local_48 = iVar20 + local_48 >> auVar29;
  iStack_44 = iVar20 + iStack_44 >> auVar29;
  iStack_40 = iVar20 + iStack_40 >> auVar29;
  iStack_3c = iVar20 + iStack_3c >> auVar29;
  local_a8 = auVar25;
  local_98 = auVar27;
  (*pcVar4)(&local_b8,coeff,0xd,1);
  auVar29._8_8_ = extraout_XMM1_Qb;
  auVar29._0_8_ = extraout_XMM1_Qa;
  bVar2 = piVar17[2];
  if ((char)bVar2 < '\0') {
    iVar20 = 1 << (~bVar2 & 0x1f);
    lVar19 = 0;
    auVar29 = ZEXT416((uint)-(int)(char)bVar2);
    auVar25 = pmovsxwd(auVar25,0x16a116a116a116a1);
    auVar27 = pmovsxwd(auVar27,0x800080008000800);
    do {
      piVar1 = (int *)((long)coeff + lVar19);
      auVar28._0_4_ = *piVar1 + iVar20 >> auVar29;
      auVar28._4_4_ = piVar1[1] + iVar20 >> auVar29;
      auVar28._8_4_ = piVar1[2] + iVar20 >> auVar29;
      auVar28._12_4_ = piVar1[3] + iVar20 >> auVar29;
      auVar28 = pmulld(auVar28,auVar25);
      piVar1 = (int *)((long)coeff + lVar19);
      *piVar1 = auVar28._0_4_ + auVar27._0_4_ >> 0xc;
      piVar1[1] = auVar28._4_4_ + auVar27._4_4_ >> 0xc;
      piVar1[2] = auVar28._8_4_ + auVar27._8_4_ >> 0xc;
      piVar1[3] = auVar28._12_4_ + auVar27._12_4_ >> 0xc;
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x80);
  }
  else {
    lVar19 = 0;
    auVar29 = pmovsxwd(auVar29,0x16a116a116a116a1);
    auVar25 = pmovsxwd(auVar25,0x800080008000800);
    do {
      piVar1 = (int *)((long)coeff + lVar19);
      auVar26._0_4_ = *piVar1 << (int)(char)bVar2;
      auVar26._4_4_ = piVar1[1];
      auVar26._8_4_ = piVar1[2];
      auVar26._12_4_ = piVar1[3];
      auVar27 = pmulld(auVar26,auVar29);
      piVar1 = (int *)((long)coeff + lVar19);
      *piVar1 = auVar27._0_4_ + auVar25._0_4_ >> 0xc;
      piVar1[1] = auVar27._4_4_ + auVar25._4_4_ >> 0xc;
      piVar1[2] = auVar27._8_4_ + auVar25._8_4_ >> 0xc;
      piVar1[3] = auVar27._12_4_ + auVar25._12_4_ >> 0xc;
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x80);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_8x4_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[8];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X4];
  const int txw_idx = get_txw_idx(TX_8X4);
  const int txh_idx = get_txh_idx(TX_8X4);
  const int txfm_size_col = tx_size_wide[TX_8X4];
  const int txfm_size_row = tx_size_high[TX_8X4];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm4x4_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x8_arr[tx_type];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col tranform
  load_buffer_8x4(input, in, stride, ud_flip, lr_flip, shift[0]);
  for (int i = 0; i < 2; i++) {
    __m128i *cur_in = &in[i * txfm_size_row];
    col_txfm(cur_in, cur_in, bitcol, 1);
    transpose_32bit_4x4(cur_in, cur_in);
  }
  col_txfm_4x8_rounding(in, -shift[1]);

  // row tranform
  row_txfm(in, outcoeff128, bitrow, 1);
  av1_round_shift_rect_array_32_sse4_1(outcoeff128, outcoeff128, txfm_size_col,
                                       -shift[2], NewSqrt2);
  (void)bd;
}